

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O1

void write_scan_header(j_compress_ptr cinfo)

{
  int iVar1;
  uint uVar2;
  jpeg_marker_writer *pjVar3;
  jpeg_component_info *pjVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  char ac_in_use [16];
  char dc_in_use [16];
  char local_48 [32];
  
  pjVar3 = cinfo->marker;
  if (cinfo->arith_code == 0) {
    if (0 < cinfo->comps_in_scan) {
      lVar6 = 0;
      do {
        pjVar4 = cinfo->cur_comp_info[lVar6];
        if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
          emit_dht(cinfo,pjVar4->dc_tbl_no,0);
        }
        if (cinfo->Se != 0) {
          emit_dht(cinfo,pjVar4->ac_tbl_no,1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < cinfo->comps_in_scan);
    }
  }
  else {
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[0x18] = '\0';
    local_48[0x19] = '\0';
    local_48[0x1a] = '\0';
    local_48[0x1b] = '\0';
    local_48[0x1c] = '\0';
    local_48[0x1d] = '\0';
    local_48[0x1e] = '\0';
    local_48[0x1f] = '\0';
    iVar7 = cinfo->comps_in_scan;
    if (0 < (long)iVar7) {
      iVar5 = cinfo->Ss;
      iVar1 = cinfo->Se;
      lVar6 = 0;
      do {
        pjVar4 = cinfo->cur_comp_info[lVar6];
        if ((iVar5 == 0) && (cinfo->Ah == 0)) {
          local_48[(long)pjVar4->dc_tbl_no + 0x10] = '\x01';
        }
        if (iVar1 != 0) {
          local_48[pjVar4->ac_tbl_no] = '\x01';
        }
        lVar6 = lVar6 + 1;
      } while (iVar7 != lVar6);
    }
    lVar6 = 0;
    iVar7 = 0;
    do {
      iVar7 = (int)local_48[lVar6] + local_48[lVar6 + 0x10] + iVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    if (iVar7 != 0) {
      emit_byte(cinfo,0xff);
      emit_byte(cinfo,0xcc);
      uVar2 = iVar7 * 2 + 2;
      emit_byte(cinfo,uVar2 >> 8 & 0xff);
      emit_byte(cinfo,uVar2 & 0xff);
      lVar6 = 0;
      do {
        if (local_48[lVar6 + 0x10] != '\0') {
          emit_byte(cinfo,(uint)lVar6);
          emit_byte(cinfo,(uint)cinfo->arith_dc_U[lVar6] * 0x10 + (uint)cinfo->arith_dc_L[lVar6]);
        }
        if (local_48[lVar6] != '\0') {
          emit_byte(cinfo,(uint)lVar6 | 0x10);
          emit_byte(cinfo,(uint)cinfo->arith_ac_K[lVar6]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
    }
  }
  if (cinfo->restart_interval != *(uint *)&pjVar3[1].write_file_header) {
    emit_byte(cinfo,0xff);
    emit_byte(cinfo,0xdd);
    emit_byte(cinfo,0);
    emit_byte(cinfo,4);
    uVar2 = cinfo->restart_interval;
    emit_byte(cinfo,uVar2 >> 8 & 0xff);
    emit_byte(cinfo,uVar2 & 0xff);
    *(uint *)&pjVar3[1].write_file_header = cinfo->restart_interval;
  }
  emit_byte(cinfo,0xff);
  emit_byte(cinfo,0xda);
  uVar2 = cinfo->comps_in_scan * 2 + 6;
  emit_byte(cinfo,uVar2 >> 8 & 0xff);
  emit_byte(cinfo,uVar2 & 0xff);
  emit_byte(cinfo,cinfo->comps_in_scan);
  if (0 < cinfo->comps_in_scan) {
    lVar6 = 0;
    do {
      pjVar4 = cinfo->cur_comp_info[lVar6];
      emit_byte(cinfo,pjVar4->component_id);
      iVar7 = 0;
      if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
        iVar7 = pjVar4->dc_tbl_no << 4;
      }
      if (cinfo->Se == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = pjVar4->ac_tbl_no;
      }
      emit_byte(cinfo,iVar5 + iVar7);
      lVar6 = lVar6 + 1;
    } while (lVar6 < cinfo->comps_in_scan);
  }
  emit_byte(cinfo,cinfo->Ss);
  emit_byte(cinfo,cinfo->Se);
  emit_byte(cinfo,cinfo->Ah * 0x10 + cinfo->Al);
  return;
}

Assistant:

METHODDEF(void)
write_scan_header (j_compress_ptr cinfo)
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;
  int i;
  jpeg_component_info *compptr;

  if (cinfo->arith_code) {
    /* Emit arith conditioning info.  We may have some duplication
     * if the file has multiple scans, but it's so small it's hardly
     * worth worrying about.
     */
    emit_dac(cinfo);
  } else {
    /* Emit Huffman tables.
     * Note that emit_dht() suppresses any duplicate tables.
     */
    for (i = 0; i < cinfo->comps_in_scan; i++) {
      compptr = cinfo->cur_comp_info[i];
      /* DC needs no table for refinement scan */
      if (cinfo->Ss == 0 && cinfo->Ah == 0)
	emit_dht(cinfo, compptr->dc_tbl_no, FALSE);
      /* AC needs no table when not present */
      if (cinfo->Se)
	emit_dht(cinfo, compptr->ac_tbl_no, TRUE);
    }
  }

  /* Emit DRI if required --- note that DRI value could change for each scan.
   * We avoid wasting space with unnecessary DRIs, however.
   */
  if (cinfo->restart_interval != marker->last_restart_interval) {
    emit_dri(cinfo);
    marker->last_restart_interval = cinfo->restart_interval;
  }

  emit_sos(cinfo);
}